

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReader::ReadTableSection(BinaryReader *this,Offset section_size)

{
  Index IVar1;
  bool bVar2;
  Result RVar3;
  undefined1 local_58 [8];
  Limits elem_limits;
  Type elem_type;
  Index table_index;
  Index i;
  Enum local_28;
  Enum local_24;
  Index num_tables;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_tables = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1c])(this->delegate_,section_size);
  bVar2 = Succeeded((Result)local_24);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    RVar3 = ReadCount(this,(Index *)&local_28,"table count");
    bVar2 = Failed(RVar3);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1d])();
      bVar2 = Succeeded(RVar3);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        for (elem_type.enum_ = Any; (uint)elem_type.enum_ < (uint)local_28;
            elem_type.enum_ = elem_type.enum_ + ~I64) {
          IVar1 = this->num_table_imports_;
          Limits::Limits((Limits *)local_58);
          RVar3 = ReadTable(this,(Type *)&elem_limits.field_0x14,(Limits *)local_58);
          bVar2 = Failed(RVar3);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1e])
                                  (this->delegate_,(ulong)(uint)(IVar1 + elem_type.enum_),
                                   (ulong)(uint)elem_limits._20_4_,local_58);
          bVar2 = Succeeded(RVar3);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnTable callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1f])();
        bVar2 = Succeeded(RVar3);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndTableSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnTableCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginTableSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadTableSection(Offset section_size) {
  CALLBACK(BeginTableSection, section_size);
  Index num_tables;
  CHECK_RESULT(ReadCount(&num_tables, "table count"));
  CALLBACK(OnTableCount, num_tables);
  for (Index i = 0; i < num_tables; ++i) {
    Index table_index = num_table_imports_ + i;
    Type elem_type;
    Limits elem_limits;
    CHECK_RESULT(ReadTable(&elem_type, &elem_limits));
    CALLBACK(OnTable, table_index, elem_type, &elem_limits);
  }
  CALLBACK0(EndTableSection);
  return Result::Ok;
}